

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall
wasm::BinaryInstWriter::emitMemoryAccess
          (BinaryInstWriter *this,size_t alignment,size_t bytes,uint64_t offset,Name memory)

{
  uint extraout_EAX;
  U32LEB x;
  Memory *pMVar1;
  U32LEB x_00;
  double in_XMM0_Qa;
  
  Bits::log2(in_XMM0_Qa);
  x.value = WasmBinaryWriter::getMemoryIndex(this->parent,memory);
  x_00.value = extraout_EAX | 0x40;
  if (x.value == 0) {
    x_00.value = extraout_EAX;
  }
  BufferWithRandomAccess::operator<<(this->o,x_00);
  if (x.value != 0) {
    BufferWithRandomAccess::operator<<(this->o,x);
  }
  pMVar1 = Module::getMemory(this->parent->wasm,memory);
  if ((pMVar1->addressType).id == 3) {
    BufferWithRandomAccess::operator<<(this->o,(U64LEB)offset);
    return;
  }
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)(uint)offset);
  return;
}

Assistant:

void BinaryInstWriter::emitMemoryAccess(size_t alignment,
                                        size_t bytes,
                                        uint64_t offset,
                                        Name memory) {
  uint32_t alignmentBits = Bits::log2(alignment ? alignment : bytes);
  uint32_t memoryIdx = parent.getMemoryIndex(memory);
  if (memoryIdx > 0) {
    // Set bit 6 in the alignment to indicate a memory index is present per:
    // https://github.com/WebAssembly/multi-memory/blob/main/proposals/multi-memory/Overview.md
    alignmentBits = alignmentBits | 1 << 6;
  }
  o << U32LEB(alignmentBits);
  if (memoryIdx > 0) {
    o << U32LEB(memoryIdx);
  }

  bool memory64 = parent.getModule()->getMemory(memory)->is64();
  if (memory64) {
    o << U64LEB(offset);
  } else {
    o << U32LEB(offset);
  }
}